

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O2

void __thiscall
dap::ResponseOrError<dap::SetBreakpointsResponse>::~ResponseOrError
          (ResponseOrError<dap::SetBreakpointsResponse> *this)

{
  std::__cxx11::string::~string((string *)&this->error);
  std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::~vector
            ((vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_> *)this);
  return;
}

Assistant:

inline ResponseOrError() = default;